

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O2

Text __thiscall loguru::ec_to_text(loguru *this,char c)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  undefined7 in_register_00000031;
  anon_class_8_1_ba1d7991 write_hex_digit;
  string str;
  anon_class_8_1_ba1d7991 local_48;
  string local_40;
  
  uVar3 = CONCAT71(in_register_00000031,c) & 0xffffffff;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"\'",(allocator<char> *)&local_48);
  iVar2 = (int)CONCAT71(in_register_00000031,c);
  local_48.str = &local_40;
  switch(uVar3) {
  case 0:
    break;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 0xb:
switchD_0010baed_caseD_1:
    if ((byte)uVar3 < 0x20) {
      std::__cxx11::string::append((char *)&local_40);
      ec_to_text::anon_class_8_1_ba1d7991::operator()(&local_48,0);
      ec_to_text::anon_class_8_1_ba1d7991::operator()(&local_48,0);
      ec_to_text::anon_class_8_1_ba1d7991::operator()(&local_48,(uint)((byte)c >> 4));
      ec_to_text::anon_class_8_1_ba1d7991::operator()(&local_48,(byte)c & 0xf);
    }
    else {
      std::__cxx11::string::push_back((char)&local_40);
    }
    goto LAB_0010bbb4;
  case 8:
    break;
  case 9:
    break;
  case 10:
    break;
  case 0xc:
    break;
  case 0xd:
    break;
  default:
    if (((iVar2 != 0x22) && (iVar2 != 0x27)) && (iVar2 != 0x5c)) goto switchD_0010baed_caseD_1;
  }
  std::__cxx11::string::append((char *)&local_40);
LAB_0010bbb4:
  std::__cxx11::string::append((char *)&local_40);
  pcVar1 = strdup(local_40._M_dataplus._M_p);
  *(char **)this = pcVar1;
  std::__cxx11::string::~string((string *)&local_40);
  return (Text)(char *)this;
}

Assistant:

Text ec_to_text(char c)
	{
		// Add quotes around the character to make it obvious where it begin and ends.
		std::string str = "'";

		auto write_hex_digit = [&](unsigned num)
		{
			if (num < 10u) { str += char('0' + num); }
			else           { str += char('a' + num - 10); }
		};

		auto write_hex_16 = [&](uint16_t n)
		{
			write_hex_digit((n >> 12u) & 0x0f);
			write_hex_digit((n >>  8u) & 0x0f);
			write_hex_digit((n >>  4u) & 0x0f);
			write_hex_digit((n >>  0u) & 0x0f);
		};

		if      (c == '\\') { str += "\\\\"; }
		else if (c == '\"') { str += "\\\""; }
		else if (c == '\'') { str += "\\\'"; }
		else if (c == '\0') { str += "\\0";  }
		else if (c == '\b') { str += "\\b";  }
		else if (c == '\f') { str += "\\f";  }
		else if (c == '\n') { str += "\\n";  }
		else if (c == '\r') { str += "\\r";  }
		else if (c == '\t') { str += "\\t";  }
		else if (0 <= c && c < 0x20) {
			str += "\\u";
			write_hex_16(static_cast<uint16_t>(c));
		} else { str += c; }

		str += "'";

		return Text{STRDUP(str.c_str())};
	}